

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int ddDagInt(DdNode *n)

{
  int iVar1;
  DdNode *pDVar2;
  int iVar3;
  
  pDVar2 = n->next;
  iVar3 = 0;
  if (((ulong)pDVar2 & 1) == 0) {
    iVar3 = 0;
    do {
      n->next = (DdNode *)((ulong)pDVar2 | 1);
      if (n->index == 0x7fffffff) {
        iVar1 = 1;
        goto LAB_007f308d;
      }
      iVar1 = ddDagInt((n->type).kids.T);
      n = (DdNode *)((ulong)(n->type).kids.E & 0xfffffffffffffffe);
      iVar3 = iVar3 + iVar1 + 1;
      pDVar2 = n->next;
    } while (((ulong)pDVar2 & 1) == 0);
    iVar1 = 0;
LAB_007f308d:
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

static int
ddDagInt(
  DdNode * n)
{
    int tval, eval;

    if (Cudd_IsComplement(n->next)) {
        return(0);
    }
    n->next = Cudd_Not(n->next);
    if (cuddIsConstant(n)) {
        return(1);
    }
    tval = ddDagInt(cuddT(n));
    eval = ddDagInt(Cudd_Regular(cuddE(n)));
    return(1 + tval + eval);

}